

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film_grain_noise_table.c
# Opt level: O0

void GenerateLumaGrainBlock
               (RK_S32 (*luma_grain_block) [82],RK_S32 bitdepth,RK_U8 num_y_points,
               RK_S32 grain_scale_shift,RK_S32 ar_coeff_lag,RK_S32 *ar_coeffs_y,
               RK_S32 ar_coeff_shift,RK_S32 grain_min,RK_S32 grain_max,RK_U16 random_seed)

{
  int iVar1;
  RK_S32 RVar2;
  int local_48;
  int local_44;
  RK_S32 deltaCol;
  RK_S32 deltaRow;
  RK_S32 wsum;
  RK_S32 pos;
  RK_S32 j;
  RK_S32 i;
  RK_U16 grain_random_register;
  RK_S32 *pRStack_28;
  RK_S32 gauss_sec_shift;
  RK_S32 *ar_coeffs_y_local;
  RK_S32 ar_coeff_lag_local;
  RK_S32 grain_scale_shift_local;
  RK_U8 num_y_points_local;
  RK_S32 (*paRStack_10) [82];
  RK_S32 bitdepth_local;
  RK_S32 (*luma_grain_block_local) [82];
  
  i = (0xc - bitdepth) + grain_scale_shift;
  j._2_2_ = random_seed;
  pRStack_28 = ar_coeffs_y;
  ar_coeffs_y_local._0_4_ = ar_coeff_lag;
  ar_coeffs_y_local._4_4_ = grain_scale_shift;
  ar_coeff_lag_local._3_1_ = num_y_points;
  grain_scale_shift_local = bitdepth;
  paRStack_10 = luma_grain_block;
  for (pos = 0; pos < 0x49; pos = pos + 1) {
    for (wsum = 0; wsum < 0x52; wsum = wsum + 1) {
      if (ar_coeff_lag_local._3_1_ == '\0') {
        paRStack_10[pos][wsum] = 0;
      }
      else {
        UpdateRandomRegister((RK_U16 *)((long)&j + 2));
        RVar2 = GetRandomNumber(j._2_2_);
        RVar2 = RoundPowerOfTwo(gaussian_sequence[RVar2],i);
        paRStack_10[pos][wsum] = RVar2;
      }
    }
  }
  for (pos = 3; pos < 0x49; pos = pos + 1) {
    for (wsum = 3; wsum < 0x4f; wsum = wsum + 1) {
      deltaRow = 0;
      deltaCol = 0;
      for (local_44 = -(RK_S32)ar_coeffs_y_local; local_44 < 1; local_44 = local_44 + 1) {
        for (local_48 = -(RK_S32)ar_coeffs_y_local;
            (local_48 <= (RK_S32)ar_coeffs_y_local && ((local_44 != 0 || (local_48 != 0))));
            local_48 = local_48 + 1) {
          deltaCol = deltaCol + pRStack_28[deltaRow] * paRStack_10[pos + local_44][wsum + local_48];
          deltaRow = deltaRow + 1;
        }
      }
      iVar1 = paRStack_10[pos][wsum];
      RVar2 = RoundPowerOfTwo(deltaCol,ar_coeff_shift);
      RVar2 = Clamp(iVar1 + RVar2,grain_min,grain_max);
      paRStack_10[pos][wsum] = RVar2;
    }
  }
  return;
}

Assistant:

void GenerateLumaGrainBlock(RK_S32 luma_grain_block[][82], RK_S32 bitdepth,
                            RK_U8 num_y_points, RK_S32 grain_scale_shift,
                            RK_S32 ar_coeff_lag, RK_S32 ar_coeffs_y[],
                            RK_S32 ar_coeff_shift, RK_S32 grain_min, RK_S32 grain_max,
                            RK_U16 random_seed)
{
    RK_S32 gauss_sec_shift = 12 - bitdepth + grain_scale_shift;
    RK_U16 grain_random_register = random_seed;
    RK_S32 i, j;
    for (i = 0; i < 73; i++) {
        for (j = 0; j < 82; j++) {
            if (num_y_points > 0) {
                UpdateRandomRegister(&grain_random_register);
                luma_grain_block[i][j] = RoundPowerOfTwo(
                                             gaussian_sequence[GetRandomNumber(grain_random_register)],
                                             gauss_sec_shift);
            } else {
                luma_grain_block[i][j] = 0;
            }
        }
    }

    for (i = 3; i < 73; i++)
        for (j = 3; j < 82 - 3; j++) {
            RK_S32 pos = 0;
            RK_S32 wsum = 0;
            RK_S32 deltaRow, deltaCol;
            for (deltaRow = -ar_coeff_lag; deltaRow <= 0; deltaRow++) {
                for (deltaCol = -ar_coeff_lag; deltaCol <= ar_coeff_lag;
                     deltaCol++) {
                    if (deltaRow == 0 && deltaCol == 0) break;
                    wsum = wsum + ar_coeffs_y[pos] *
                           luma_grain_block[i + deltaRow][j + deltaCol];
                    ++pos;
                }
            }
            luma_grain_block[i][j] =
                Clamp(luma_grain_block[i][j] + RoundPowerOfTwo(wsum, ar_coeff_shift),
                      grain_min, grain_max);
        }
}